

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  LogMessage *pLVar5;
  CommandLineInterface *this_00;
  string parameters;
  string parameters_1;
  string error;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_38,&output_directive->name);
    stringpiece_internal::StringPiece::StringPiece(&local_48,"--");
    bVar1 = HasPrefixString(local_38,local_48);
    if (bVar1) {
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_58,&output_directive->name);
      stringpiece_internal::StringPiece::StringPiece(&local_68,"_out");
      bVar1 = HasSuffixString(local_58,local_68);
      if (!bVar1) goto LAB_0027f40a;
    }
    else {
LAB_0027f40a:
      internal::LogMessage::LogMessage
                ((LogMessage *)&parameters,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x85e);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)&parameters,
                          "CHECK failed: HasPrefixString(output_directive.name, \"--\") && HasSuffixString(output_directive.name, \"_out\"): "
                         );
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"Bad name for plugin generator: ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,&output_directive->name);
      internal::LogFinisher::operator=((LogFinisher *)&parameters_1,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&parameters);
    }
    anon_unknown_4::PluginName(&parameters,&this->plugin_prefix_,&output_directive->name);
    std::__cxx11::string::string((string *)&parameters_1,(string *)&output_directive->parameter);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->plugin_parameters_,&parameters);
    if (pmVar3->_M_string_length != 0) {
      if (parameters_1._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters_1);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->plugin_parameters_,&parameters);
      std::__cxx11::string::append((string *)&parameters_1);
    }
    bVar1 = GeneratePluginOutput
                      (this,parsed_files,&parameters,&parameters_1,generator_context,&error);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&parameters_1);
LAB_0027f502:
      std::__cxx11::string::~string((string *)&parameters);
      bVar1 = true;
      goto LAB_0027f559;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,(string *)&error);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&parameters_1);
  }
  else {
    std::__cxx11::string::string((string *)&parameters,(string *)&output_directive->parameter);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->generator_parameters_,&output_directive->name);
    if (pmVar3->_M_string_length != 0) {
      if (parameters._M_string_length != 0) {
        std::__cxx11::string::append((char *)&parameters);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::append((string *)&parameters);
    }
    this_00 = (CommandLineInterface *)output_directive->generator;
    iVar2 = (**(_func_int **)((long)(this_00->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar1 = EnforceProto3OptionalSupport
                      (this_00,&output_directive->name,CONCAT44(extraout_var,iVar2),parsed_files);
    if (bVar1) {
      iVar2 = (*output_directive->generator->_vptr_CodeGenerator[3])
                        (output_directive->generator,parsed_files,&parameters,generator_context,
                         &error);
      if ((char)iVar2 != '\0') goto LAB_0027f502;
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)output_directive);
      poVar4 = std::operator<<(poVar4,": ");
      poVar4 = std::operator<<(poVar4,(string *)&error);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  std::__cxx11::string::~string((string *)&parameters);
  bVar1 = false;
LAB_0027f559:
  std::__cxx11::string::~string((string *)&error);
  return bVar1;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == NULL) {
    // This is a plugin.
    GOOGLE_CHECK(HasPrefixString(output_directive.name, "--") &&
          HasSuffixString(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}